

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.h
# Opt level: O2

void __thiscall llbuild::buildsystem::Command::addOutput(Command *this,BuildNode *node)

{
  Command *local_20;
  BuildNode *local_18;
  
  local_18 = node;
  std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ::push_back(&this->outputs,&local_18);
  local_20 = this;
  std::vector<llbuild::buildsystem::Command*,std::allocator<llbuild::buildsystem::Command*>>::
  emplace_back<llbuild::buildsystem::Command*>
            ((vector<llbuild::buildsystem::Command*,std::allocator<llbuild::buildsystem::Command*>>
              *)&(local_18->super_Node).producers,&local_20);
  return;
}

Assistant:

virtual void addOutput(BuildNode* node) final {
    outputs.push_back(node);
    node->getProducers().push_back(this);
  }